

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void bfR2(float *ioptr,long M,long NDiffU)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  float *pfVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pfVar12 = ioptr + 0xf;
  uVar11 = (ulong)(1L << (M & 0x3fU)) >> 3;
  while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
    uVar7 = *(ulong *)(pfVar12 + -0xf);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar7;
    uVar8 = *(ulong *)(pfVar12 + -0xb);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar8;
    uVar9 = *(ulong *)(pfVar12 + -3);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar9;
    auVar17._0_4_ = (float)uVar8 + (float)uVar7;
    auVar17._4_4_ = (float)(uVar8 >> 0x20) + (float)(uVar7 >> 0x20);
    auVar17._8_8_ = 0;
    auVar14 = vsubps_avx(auVar14,auVar15);
    uVar7 = *(ulong *)(pfVar12 + -7);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar7;
    uVar10 = vmovlps_avx(auVar17);
    *(undefined8 *)(pfVar12 + -0xf) = uVar10;
    uVar10 = vmovlps_avx(auVar14);
    *(undefined8 *)(pfVar12 + -0xb) = uVar10;
    auVar19._0_4_ = (float)uVar9 + (float)uVar7;
    auVar19._4_4_ = (float)(uVar9 >> 0x20) + (float)(uVar7 >> 0x20);
    auVar19._8_8_ = 0;
    auVar14 = vsubps_avx(auVar16,auVar18);
    uVar10 = vmovlps_avx(auVar19);
    *(undefined8 *)(pfVar12 + -7) = uVar10;
    uVar10 = vmovlps_avx(auVar14);
    *(undefined8 *)(pfVar12 + -3) = uVar10;
    fVar1 = pfVar12[-0xd];
    fVar2 = pfVar12[-0xc];
    fVar3 = pfVar12[-9];
    fVar4 = pfVar12[-5];
    fVar5 = pfVar12[-4];
    fVar6 = pfVar12[-1];
    pfVar12[-0xd] = pfVar12[-8] + fVar1;
    pfVar12[-0xc] = fVar2 - fVar3;
    pfVar12[-9] = fVar1 - pfVar12[-8];
    pfVar12[-8] = fVar3 + fVar2;
    pfVar12[-5] = *pfVar12 + fVar4;
    pfVar12[-4] = fVar5 - fVar6;
    pfVar12[-1] = fVar4 - *pfVar12;
    *pfVar12 = fVar6 + fVar5;
    pfVar12 = pfVar12 + 0x10;
  }
  return;
}

Assistant:

static inline void bfR2(float *ioptr, long M, long NDiffU) {
/*** 2nd radix 2 stage ***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	SameUCnt;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;

float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 4;
pos = 2;
posi = pos+1;
NSameU = POW2(M) / 4 /NDiffU;	// 4 Us at a time
pstrt = ioptr;
p0r = pstrt;
p1r = pstrt+pinc;
p2r = p1r+pinc;
p3r = p2r+pinc;

		/* Butterflys		*/
		/*
		f0	-	-	f4
		f1	-  1 -	f5
		f2	-	-	f6
		f3	-  1 -	f7
		*/
		/* Butterflys		*/
		/*
		f0	-	-	f4
		f1	-  1 -	f5
		f2	-	-	f6
		f3	-  1 -	f7
		*/

for (SameUCnt = NSameU; SameUCnt > 0 ; SameUCnt--){

	f0r = *p0r;
	f1r = *p1r;
	f0i = *(p0r + 1);
	f1i = *(p1r + 1);
	f2r = *p2r;
	f3r = *p3r;
	f2i = *(p2r + 1);
	f3i = *(p3r + 1);

	f4r = f0r + f1r;
	f4i = f0i + f1i;
	f5r = f0r - f1r;
	f5i = f0i - f1i;

	f6r = f2r + f3r;
	f6i = f2i + f3i;
	f7r = f2r - f3r;
	f7i = f2i - f3i;

	*p0r = f4r;
	*(p0r + 1) = f4i;
	*p1r = f5r;
	*(p1r + 1) = f5i;
	*p2r = f6r;
	*(p2r + 1) = f6i;
	*p3r = f7r;
	*(p3r + 1) = f7i;

	f0r = *(p0r + pos);
	f1i = *(p1r + posi);
	f0i = *(p0r + posi);
	f1r = *(p1r + pos);
	f2r = *(p2r + pos);
	f3i = *(p3r + posi);
	f2i = *(p2r + posi);
	f3r = *(p3r + pos);

	f4r = f0r + f1i;
	f4i = f0i - f1r;
	f5r = f0r - f1i;
	f5i = f0i + f1r;

	f6r = f2r + f3i;
	f6i = f2i - f3r;
	f7r = f2r - f3i;
	f7i = f2i + f3r;

	*(p0r + pos) = f4r;
	*(p0r + posi) = f4i;
	*(p1r + pos) = f5r;
	*(p1r + posi) = f5i;
	*(p2r + pos) = f6r;
	*(p2r + posi) = f6i;
	*(p3r + pos) = f7r;
	*(p3r + posi) = f7i;

	p0r += pnext;
	p1r += pnext;
	p2r += pnext;
	p3r += pnext;

}
}